

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

bb_insn_t_conflict create_bb_insn(gen_ctx_t gen_ctx,MIR_insn_t insn,bb_t_conflict bb)

{
  uint32_t uVar1;
  uchar uVar2;
  int iVar3;
  bb_insn_t_conflict pbVar4;
  bitmap_t pVVar5;
  bb_insn_t_conflict bb_insn;
  bb_t_conflict bb_local;
  MIR_insn_t insn_local;
  gen_ctx_t gen_ctx_local;
  
  pbVar4 = (bb_insn_t_conflict)gen_malloc(gen_ctx,0x58);
  insn->data = pbVar4;
  pbVar4->bb = bb;
  pbVar4->insn = insn;
  pbVar4->gvn_val_const_p = '\0';
  uVar2 = '\0';
  if ((int)*(undefined8 *)&insn->field_0x18 == 0xad) {
    uVar2 = '\x03';
  }
  pbVar4->alloca_flag = uVar2;
  pbVar4->call_hard_reg_args = (bitmap_t)0x0;
  if (gen_ctx->curr_cfg->curr_bb_insn_index != 0xffffffff) {
    uVar1 = gen_ctx->curr_cfg->curr_bb_insn_index;
    gen_ctx->curr_cfg->curr_bb_insn_index = uVar1 + 1;
    pbVar4->index = uVar1;
    pbVar4->mem_index = 0;
    pbVar4->gvn_val = (ulong)pbVar4->index;
    DLIST_dead_var_t_init(&pbVar4->insn_dead_vars);
    iVar3 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&insn->field_0x18);
    if (iVar3 != 0) {
      pVVar5 = bitmap_create2(0x22);
      pbVar4->call_hard_reg_args = pVVar5;
    }
    pbVar4->label_disp = 0;
    return pbVar4;
  }
  __assert_fail("gen_ctx->curr_cfg->curr_bb_insn_index != (uint32_t) ~0ull",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x25f,"bb_insn_t create_bb_insn(gen_ctx_t, MIR_insn_t, bb_t)");
}

Assistant:

static bb_insn_t create_bb_insn (gen_ctx_t gen_ctx, MIR_insn_t insn, bb_t bb) {
  bb_insn_t bb_insn = gen_malloc (gen_ctx, sizeof (struct bb_insn));

  insn->data = bb_insn;
  bb_insn->bb = bb;
  bb_insn->insn = insn;
  bb_insn->gvn_val_const_p = FALSE;
  bb_insn->alloca_flag = insn->code == MIR_ALLOCA ? MAY_ALLOCA | MUST_ALLOCA : 0;
  bb_insn->call_hard_reg_args = NULL;
  gen_assert (curr_cfg->curr_bb_insn_index != (uint32_t) ~0ull);
  bb_insn->index = curr_cfg->curr_bb_insn_index++;
  bb_insn->mem_index = 0;
  bb_insn->gvn_val = bb_insn->index;
  DLIST_INIT (dead_var_t, bb_insn->insn_dead_vars);
  if (MIR_call_code_p (insn->code)) bb_insn->call_hard_reg_args = bitmap_create2 (MAX_HARD_REG + 1);
  bb_insn->label_disp = 0;
  return bb_insn;
}